

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O2

Ptr visualize_matching(Result *matching,Ptr *image1,Ptr *image2,
                      vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *pos1
                      ,vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       *pos2)

{
  element_type *peVar1;
  pointer pVVar2;
  Result *pRVar3;
  ostream *poVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_R9;
  size_t i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  Ptr PVar8;
  undefined1 local_b0 [8];
  Correspondence2D2D match;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  long *local_70;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *local_68;
  Result *local_60;
  Ptr *match_image;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 auStack_48 [8];
  Correspondences2D2D vis_matches;
  
  auStack_48 = (undefined1  [8])0x0;
  vis_matches.super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vis_matches.super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 8;
  uVar5 = 0;
  local_70 = in_R9;
  local_68 = pos2;
  local_60 = matching;
  match_image = (Ptr *)pos1;
  local_50 = &image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  for (; peVar1 = (image1->
                  super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      , uVar5 < (ulong)((long)(image1->
                              super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_refcount._M_pi - (long)peVar1 >> 2); uVar5 = uVar5 + 1) {
    lVar6 = (long)*(int *)((long)&(peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.
                                  _vptr_ImageBase + uVar5 * 4);
    if (-1 < lVar6) {
      pVVar2 = (local_68->
               super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<float_const*,double*>
                ((float *)((long)pVVar2[-1].v + lVar7),(float *)((long)pVVar2->v + lVar7),
                 (double *)local_b0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<float_const*,double*>
                ((float *)(*local_70 + lVar6 * 8),(float *)(*local_70 + lVar6 * 8 + 8),match.p1 + 1)
      ;
      std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::push_back
                ((vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_> *)
                 auStack_48,(value_type *)local_b0);
    }
    lVar7 = lVar7 + 8;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Drawing ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," matches...");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<unsigned_char>,void>
            ((__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> *)
             (match.p2 + 1),local_50);
  std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<unsigned_char>,void>
            (local_80,&match_image->
                       super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  pRVar3 = local_60;
  features::Visualizer::draw_matches
            ((Visualizer *)local_60,(ConstPtr *)(match.p2 + 1),(ConstPtr *)local_80,
             (Correspondences2D2D *)auStack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::_Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
  ~_Vector_base((_Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_> *)
                auStack_48);
  PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pRVar3;
  return (Ptr)PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

core::ByteImage::Ptr
visualize_matching (features::Matching::Result const& matching,
    core::ByteImage::Ptr image1, core::ByteImage::Ptr image2,
    std::vector<math::Vec2f> const& pos1, std::vector<math::Vec2f> const& pos2)
{
    /* Visualize keypoints. */
    sfm::Correspondences2D2D vis_matches;
    for (std::size_t i = 0; i < matching.matches_1_2.size(); ++i)
    {
        if (matching.matches_1_2[i] < 0)
            continue;
        int const j = matching.matches_1_2[i];

        sfm::Correspondence2D2D match;
        std::copy(pos1[i].begin(), pos1[i].end(), match.p1);
        std::copy(pos2[j].begin(), pos2[j].end(), match.p2);
        vis_matches.push_back(match);
    }

    std::cout << "Drawing " << vis_matches.size() << " matches..." << std::endl;
    core::ByteImage::Ptr match_image = sfm::Visualizer::draw_matches
        (image1, image2, vis_matches);
    return match_image;
}